

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5MultiIterAdvanceRowid(Fts5Iter *pIter,int iChanged,Fts5SegIter **ppFirst)

{
  long lVar1;
  Fts5CResult *pFVar2;
  Fts5SegIter *pFVar3;
  uint uVar4;
  i64 iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  Fts5SegIter *pFVar9;
  
  pFVar3 = pIter->aSeg + (uint)iChanged;
  lVar1 = pIter->aSeg[(uint)iChanged].iRowid;
  if (lVar1 == pIter->iSwitchRowid) {
    uVar4 = pIter->bRev;
  }
  else {
    uVar4 = (uint)(lVar1 < pIter->iSwitchRowid);
    if (pIter->bRev != uVar4) goto LAB_001ccc47;
  }
  uVar8 = (ulong)(iChanged ^ 1);
  iVar5 = -0x8000000000000000;
  if (uVar4 == 0) {
    iVar5 = 0x7fffffffffffffff;
  }
  pIter->iSwitchRowid = iVar5;
  pFVar2 = pIter->aFirst;
  uVar6 = iChanged + pIter->nSeg;
  while( true ) {
    uVar7 = (int)uVar6 / 2;
    if (pFVar2[(int)uVar7].bTermEq != '\0') {
      pFVar9 = pIter->aSeg + uVar8;
      lVar1 = pFVar9->iRowid;
      if (pFVar3->iRowid == lVar1) {
        return 1;
      }
      if ((uVar4 == pFVar3->iRowid < lVar1) || (pFVar9 = pFVar3, uVar4 == iVar5 < lVar1)) {
        pFVar3 = pFVar9;
        pIter->iSwitchRowid = lVar1;
        iVar5 = lVar1;
      }
    }
    pFVar2[(int)uVar7].iFirst = (short)((uint)((int)pFVar3 - (int)pIter->aSeg) >> 3) * -0x1111;
    if ((uVar6 & 0xfffffffe) == 2) break;
    uVar8 = (ulong)pFVar2[(int)(uVar7 ^ 1)].iFirst;
    uVar6 = uVar7;
  }
LAB_001ccc47:
  *ppFirst = pFVar3;
  return 0;
}

Assistant:

static int fts5MultiIterAdvanceRowid(
  Fts5Iter *pIter,                /* Iterator to update aFirst[] array for */
  int iChanged,                   /* Index of sub-iterator just advanced */
  Fts5SegIter **ppFirst
){
  Fts5SegIter *pNew = &pIter->aSeg[iChanged];

  if( pNew->iRowid==pIter->iSwitchRowid
   || (pNew->iRowid<pIter->iSwitchRowid)==pIter->bRev
  ){
    int i;
    Fts5SegIter *pOther = &pIter->aSeg[iChanged ^ 0x0001];
    pIter->iSwitchRowid = pIter->bRev ? SMALLEST_INT64 : LARGEST_INT64;
    for(i=(pIter->nSeg+iChanged)/2; 1; i=i/2){
      Fts5CResult *pRes = &pIter->aFirst[i];

      assert( pNew->pLeaf );
      assert( pRes->bTermEq==0 || pOther->pLeaf );

      if( pRes->bTermEq ){
        if( pNew->iRowid==pOther->iRowid ){
          return 1;
        }else if( (pOther->iRowid>pNew->iRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
          pNew = pOther;
        }else if( (pOther->iRowid>pIter->iSwitchRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
        }
      }
      pRes->iFirst = (u16)(pNew - pIter->aSeg);
      if( i==1 ) break;

      pOther = &pIter->aSeg[ pIter->aFirst[i ^ 0x0001].iFirst ];
    }
  }

  *ppFirst = pNew;
  return 0;
}